

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::HasBitsSize(MessageGenerator *this)

{
  size_t local_18;
  size_t sizeof_has_bits;
  MessageGenerator *this_local;
  
  local_18 = (size_t)((this->max_has_bit_index_ + 0x1f) / 0x20 << 2);
  if (local_18 == 0) {
    local_18 = 4;
  }
  return local_18;
}

Assistant:

size_t MessageGenerator::HasBitsSize() const {
  size_t sizeof_has_bits = (max_has_bit_index_ + 31) / 32 * 4;
  if (sizeof_has_bits == 0) {
    // Zero-size arrays aren't technically allowed, and MSVC in particular
    // doesn't like them.  We still need to declare these arrays to make
    // other code compile.  Since this is an uncommon case, we'll just declare
    // them with size 1 and waste some space.  Oh well.
    sizeof_has_bits = 4;
  }

  return sizeof_has_bits;
}